

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O3

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_naive_matches_jmp_::run
          (Test_bitileave_ileaveBytes_naive_matches_jmp_ *this)

{
  string_view msg;
  SourceLocation loc;
  char *pcVar1;
  char *pcVar2;
  long *plVar3;
  size_type *psVar4;
  uint64_t bytes;
  long lVar5;
  ulong uVar6;
  uint64_t naive;
  uint64_t jmp;
  size_t in_stack_fffffffffffffee0;
  char *local_110;
  _Alloc_hider local_108;
  size_type local_100;
  char local_f8 [8];
  undefined8 in_stack_ffffffffffffff10;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bytes = 0x3039;
  lVar5 = 0x4000;
  uVar6 = 0;
  do {
    bytes = bytes * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    pcVar1 = (char *)detail::ileaveBytes_jmp(bytes,uVar6 % 9);
    local_110 = pcVar1;
    pcVar2 = (char *)detail::ileaveBytes_naive(bytes,uVar6 % 9);
    if (pcVar1 != pcVar2) {
      detail::stringify_impl<unsigned_long>(&local_90,(unsigned_long *)&local_110);
      std::operator+(&local_70,"Comparison failed: jmp == naive (with \"jmp\"=",&local_90);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_108._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_108._M_p == psVar4) {
        local_f8 = (char  [8])*psVar4;
        in_stack_ffffffffffffff10 = plVar3[3];
        local_108._M_p = local_f8;
      }
      else {
        local_f8 = (char  [8])*psVar4;
      }
      local_100 = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      detail::stringify_impl<unsigned_long>(&local_b0,(unsigned_long *)&stack0xfffffffffffffee8);
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108
                     ,&local_b0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      *plVar3 = (long)(plVar3 + 2);
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      msg._M_str = pcVar2;
      msg._M_len = in_stack_fffffffffffffee0;
      loc.function = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc.file = (char *)in_stack_ffffffffffffff10;
      loc.line = (unsigned_long)"run";
      assertFail(msg,loc);
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_naive_matches_jmp)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint64_t bytesAsInt = distr(rng);

        std::uint64_t jmp = detail::ileaveBytes_jmp(bytesAsInt, i % 9);
        std::uint64_t naive = detail::ileaveBytes_naive(bytesAsInt, i % 9);
        BITMANIP_ASSERT_EQ(jmp, naive);
    }
}